

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O0

int xmlXIncludeProcessTreeFlags(xmlNodePtr tree,int flags)

{
  xmlXIncludeCtxtPtr ctxt_00;
  xmlChar *pxVar1;
  int local_2c;
  int ret;
  xmlXIncludeCtxtPtr ctxt;
  int flags_local;
  xmlNodePtr tree_local;
  
  if (((tree == (xmlNodePtr)0x0) || (tree->type == XML_NAMESPACE_DECL)) ||
     (tree->doc == (_xmlDoc *)0x0)) {
    tree_local._4_4_ = -1;
  }
  else {
    ctxt_00 = xmlXIncludeNewContext(tree->doc);
    if (ctxt_00 == (xmlXIncludeCtxtPtr)0x0) {
      tree_local._4_4_ = -1;
    }
    else {
      pxVar1 = xmlNodeGetBase(tree->doc,tree);
      ctxt_00->base = pxVar1;
      xmlXIncludeSetFlags(ctxt_00,flags);
      local_2c = xmlXIncludeDoProcess(ctxt_00,tree);
      if ((-1 < local_2c) && (0 < ctxt_00->nbErrors)) {
        local_2c = -1;
      }
      xmlXIncludeFreeContext(ctxt_00);
      tree_local._4_4_ = local_2c;
    }
  }
  return tree_local._4_4_;
}

Assistant:

int
xmlXIncludeProcessTreeFlags(xmlNodePtr tree, int flags) {
    xmlXIncludeCtxtPtr ctxt;
    int ret = 0;

    if ((tree == NULL) || (tree->type == XML_NAMESPACE_DECL) ||
        (tree->doc == NULL))
	return(-1);
    ctxt = xmlXIncludeNewContext(tree->doc);
    if (ctxt == NULL)
	return(-1);
    ctxt->base = xmlNodeGetBase(tree->doc, tree);
    xmlXIncludeSetFlags(ctxt, flags);
    ret = xmlXIncludeDoProcess(ctxt, tree);
    if ((ret >= 0) && (ctxt->nbErrors > 0))
	ret = -1;

    xmlXIncludeFreeContext(ctxt);
    return(ret);
}